

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_getnameinfo.c
# Opt level: O0

void nameinfo_callback(void *arg,int status,int timeouts,hostent *host)

{
  char *s2;
  char local_1b8 [8];
  char ipbuf [62];
  char *end;
  char *domain;
  char buf [255];
  char *local_60;
  char *service;
  char srvbuf [33];
  nameinfo_query *niquery;
  hostent *host_local;
  int timeouts_local;
  int status_local;
  void *arg_local;
  
  local_60 = (char *)0x0;
  *(long *)((long)arg + 0x38) = (long)timeouts + *(long *)((long)arg + 0x38);
  if (status == 0) {
    if ((*(uint *)((long)arg + 0x30) & 0x200) != 0) {
      if (*(int *)((long)arg + 0x2c) == 2) {
        local_60 = lookup_service(*(unsigned_short *)((long)arg + 0x12),*(uint *)((long)arg + 0x30),
                                  (char *)&service,0x21);
      }
      else {
        local_60 = lookup_service(*(unsigned_short *)((long)arg + 0x12),*(uint *)((long)arg + 0x30),
                                  (char *)&service,0x21);
      }
    }
    if ((*(uint *)((long)arg + 0x30) & 1) != 0) {
      gethostname((char *)&domain,0xff);
      s2 = strchr((char *)&domain,0x2e);
      if ((s2 != (char *)0x0) &&
         (register0x00000000 = ares_striendstr(host->h_name,s2), register0x00000000 != (char *)0x0))
      {
        *register0x00000000 = '\0';
      }
    }
    (**arg)(*(undefined8 *)((long)arg + 8),0,*(ulong *)((long)arg + 0x38) & 0xffffffff,host->h_name,
            local_60);
    ares_free(arg);
  }
  else if ((status == 4) && ((*(uint *)((long)arg + 0x30) & 4) == 0)) {
    if (*(int *)((long)arg + 0x2c) == 2) {
      ares_inet_ntop(2,(void *)((long)arg + 0x14),local_1b8,0x3e);
    }
    else {
      ares_inet_ntop(10,(void *)((long)arg + 0x18),local_1b8,0x3e);
      append_scopeid((sockaddr_in6 *)((long)arg + 0x10),*(uint *)((long)arg + 0x30),local_1b8,0x3e);
    }
    if ((*(uint *)((long)arg + 0x30) & 0x200) != 0) {
      if (*(int *)((long)arg + 0x2c) == 2) {
        local_60 = lookup_service(*(unsigned_short *)((long)arg + 0x12),*(uint *)((long)arg + 0x30),
                                  (char *)&service,0x21);
      }
      else {
        local_60 = lookup_service(*(unsigned_short *)((long)arg + 0x12),*(uint *)((long)arg + 0x30),
                                  (char *)&service,0x21);
      }
    }
    (**arg)(*(undefined8 *)((long)arg + 8),0,*(ulong *)((long)arg + 0x38) & 0xffffffff,local_1b8,
            local_60);
    ares_free(arg);
  }
  else {
    (**arg)(*(undefined8 *)((long)arg + 8),status,*(ulong *)((long)arg + 0x38) & 0xffffffff,0);
    ares_free(arg);
  }
  return;
}

Assistant:

static void nameinfo_callback(void *arg, int status, int timeouts,
                              struct hostent *host)
{
  struct nameinfo_query *niquery = (struct nameinfo_query *)arg;
  char                   srvbuf[33];
  char                  *service = NULL;

  niquery->timeouts += (size_t)timeouts;
  if (status == ARES_SUCCESS) {
    /* They want a service too */
    if (niquery->flags & ARES_NI_LOOKUPSERVICE) {
      if (niquery->family == AF_INET) {
        service = lookup_service(niquery->addr.addr4.sin_port, niquery->flags,
                                 srvbuf, sizeof(srvbuf));
      } else {
        service = lookup_service(niquery->addr.addr6.sin6_port, niquery->flags,
                                 srvbuf, sizeof(srvbuf));
      }
    }
    /* NOFQDN means we have to strip off the domain name portion.  We do
       this by determining our own domain name, then searching the string
       for this domain name and removing it.
     */
#ifdef HAVE_GETHOSTNAME
    if (niquery->flags & ARES_NI_NOFQDN) {
      char        buf[255];
      const char *domain;
      gethostname(buf, 255);
      if ((domain = strchr(buf, '.')) != NULL) {
        char *end = ares_striendstr(host->h_name, domain);
        if (end) {
          *end = 0;
        }
      }
    }
#endif
    niquery->callback(niquery->arg, ARES_SUCCESS, (int)niquery->timeouts,
                      host->h_name, service);
    ares_free(niquery);
    return;
  }
  /* We couldn't find the host, but it's OK, we can use the IP */
  else if (status == ARES_ENOTFOUND && !(niquery->flags & ARES_NI_NAMEREQD)) {
    char ipbuf[IPBUFSIZ];
    if (niquery->family == AF_INET) {
      ares_inet_ntop(AF_INET, &niquery->addr.addr4.sin_addr, ipbuf, IPBUFSIZ);
    } else {
      ares_inet_ntop(AF_INET6, &niquery->addr.addr6.sin6_addr, ipbuf, IPBUFSIZ);
#ifdef HAVE_STRUCT_SOCKADDR_IN6_SIN6_SCOPE_ID
      append_scopeid(&niquery->addr.addr6, niquery->flags, ipbuf,
                     sizeof(ipbuf));
#endif
    }
    /* They want a service too */
    if (niquery->flags & ARES_NI_LOOKUPSERVICE) {
      if (niquery->family == AF_INET) {
        service = lookup_service(niquery->addr.addr4.sin_port, niquery->flags,
                                 srvbuf, sizeof(srvbuf));
      } else {
        service = lookup_service(niquery->addr.addr6.sin6_port, niquery->flags,
                                 srvbuf, sizeof(srvbuf));
      }
    }
    niquery->callback(niquery->arg, ARES_SUCCESS, (int)niquery->timeouts, ipbuf,
                      service);
    ares_free(niquery);
    return;
  }
  niquery->callback(niquery->arg, status, (int)niquery->timeouts, NULL, NULL);
  ares_free(niquery);
}